

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O3

void ppc6xx_tlb_store(CPUPPCState_conflict2 *env,target_ulong EPN,int way,int is_code,
                     target_ulong pte0,target_ulong pte1)

{
  ppc6xx_tlb_t_conflict2 *ppVar1;
  ppc6xx_tlb_t_conflict2 *ppVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  uVar8 = (uint)(EPN >> 0xc);
  iVar4 = env->tlb_per_way * way + (env->tlb_per_way - 1U & uVar8);
  if ((is_code != 0) && (env->id_tlbs == 1)) {
    iVar4 = iVar4 + env->nb_tlb;
  }
  ppVar2 = (env->tlb).tlb6;
  iVar3 = env->nb_ways;
  if (0 < iVar3) {
    iVar7 = 0;
    do {
      iVar5 = env->tlb_per_way * iVar7 + (env->tlb_per_way - 1U & uVar8);
      if ((is_code != 0) && (env->id_tlbs == 1)) {
        iVar5 = iVar5 + env->nb_tlb;
      }
      uVar6 = (uint)(env->tlb).tlb6[iVar5].pte0;
      if (((int)uVar6 < 0) && (ppVar1 = (env->tlb).tlb6 + iVar5, ppVar1->EPN == EPN)) {
        ppVar1->pte0 = (ulong)(uVar6 & 0x7fffffff);
        tlb_flush_page_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,EPN);
        iVar3 = env->nb_ways;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar3);
  }
  ppVar2[iVar4].pte0 = pte0;
  ppVar2[iVar4].pte1 = pte1;
  ppVar2[iVar4].EPN = EPN;
  env->last_way = way;
  return;
}

Assistant:

static void ppc6xx_tlb_store(CPUPPCState *env, target_ulong EPN, int way,
                             int is_code, target_ulong pte0, target_ulong pte1)
{
    ppc6xx_tlb_t *tlb;
    int nr;

    nr = ppc6xx_tlb_getnum(env, EPN, way, is_code);
    tlb = &env->tlb.tlb6[nr];
    LOG_SWTLB("Set TLB %d/%d EPN " TARGET_FMT_lx " PTE0 " TARGET_FMT_lx
              " PTE1 " TARGET_FMT_lx "\n", nr, env->nb_tlb, EPN, pte0, pte1);
    /* Invalidate any pending reference in QEMU for this virtual address */
    ppc6xx_tlb_invalidate_virt2(env, EPN, is_code, 1);
    tlb->pte0 = pte0;
    tlb->pte1 = pte1;
    tlb->EPN = EPN;
    /* Store last way for LRU mechanism */
    env->last_way = way;
}